

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O0

int __thiscall primesieve::PrimeGenerator::init(PrimeGenerator *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  PrimeGenerator *pPVar1;
  size_t sVar2;
  size_t sVar3;
  const_iterator pvVar4;
  long *in_RDX;
  size_t b;
  size_t a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  PrimeGenerator *in_stack_ffffffffffffffb0;
  PrimeGenerator *this_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffc8;
  
  this_01 = (PrimeGenerator *)(this->super_Erat).start_;
  pPVar1 = (PrimeGenerator *)maxCachedPrime();
  if (this_01 <= pPVar1) {
    sVar2 = getStartIdx(in_stack_ffffffffffffffb0);
    sVar3 = getStopIdx(this_01);
    *in_RDX = sVar3 - sVar2;
    pvVar4 = std::array<unsigned_long,_128UL>::begin((array<unsigned_long,_128UL> *)0x153ea7);
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pvVar4 + sVar2);
    std::array<unsigned_long,_128UL>::begin((array<unsigned_long,_128UL> *)0x153ec3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
    std::
    copy<unsigned_long_const*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((unsigned_long *)this_01,(unsigned_long *)this,in_stack_ffffffffffffffc8);
  }
  initErat(this_01);
  return extraout_EAX;
}

Assistant:

void PrimeGenerator::init(vector<uint64_t>& primes, size_t* size)
{
  if (start_ <= maxCachedPrime())
  {
    size_t a = getStartIdx();
    size_t b = getStopIdx();

    *size = b - a;
    assert(*size <= primes.size());

    copy(smallPrimes.begin() + a,
         smallPrimes.begin() + b,
         primes.begin());
  }

  initErat();
}